

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void __thiscall
embree::SceneGraph::TransformNode::calculateStatistics(TransformNode *this,Statistics *stat)

{
  size_t sVar1;
  Node *pNVar2;
  
  sVar1 = (this->super_Node).indegree;
  (this->super_Node).indegree = sVar1 + 1;
  if (sVar1 == 0) {
    (*(((this->child).ptr)->super_RefCount)._vptr_RefCount[9])();
    stat->numTransformNodes = stat->numTransformNodes + 1;
    if (((this->child).ptr)->indegree == 1) {
      stat->numTransformedObjects = stat->numTransformedObjects + 1;
    }
    if (1 < (this->spaces).spaces.size_active) {
      pNVar2 = (this->child).ptr;
      (*(pNVar2->super_RefCount)._vptr_RefCount[9])(pNVar2,stat);
      return;
    }
  }
  return;
}

Assistant:

void SceneGraph::TransformNode::calculateStatistics(Statistics& stat)
  {
    indegree++;
    if (indegree == 1)
    {
      child->calculateStatistics(stat);
      
      stat.numTransformNodes++;
      if (child->indegree == 1)
        stat.numTransformedObjects++;
      
      if (spaces.size() > 1) child->calculateStatistics(stat); // break instance up when motion blur is used
    }
  }